

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * duckdb_fmt::v6::internal::
       parse_width<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  size_type __dnew;
  string local_78;
  string local_58;
  size_type local_38;
  
  bVar1 = *begin;
  if ((byte)(bVar1 - 0x30) < 10) {
    begin = begin + 1;
    uVar3 = 0;
    pbVar2 = (byte *)begin;
    if (bVar1 != 0x30) {
      do {
        if (0xccccccc < uVar3) {
          begin = (char *)(pbVar2 + -1);
          uVar3 = 0x80000000;
          goto LAB_0075d165;
        }
        uVar3 = ((uint)bVar1 + uVar3 * 10) - 0x30;
        begin = end;
        if (pbVar2 == (byte *)end) break;
        bVar1 = *pbVar2;
        begin = (char *)pbVar2;
        pbVar2 = pbVar2 + 1;
      } while ((byte)(bVar1 - 0x30) < 10);
      if ((int)uVar3 < 0) {
LAB_0075d165:
        local_38 = 0x11;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_38);
        local_78.field_2._M_allocated_capacity = local_38;
        builtin_strncpy(local_78._M_dataplus._M_p,"number is too big",0x11);
        local_78._M_string_length = local_38;
        local_78._M_dataplus._M_p[local_38] = '\0';
        specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        ::on_error(&handler->
                    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                   ,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
    }
    ((handler->
     super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->width = uVar3;
  }
  else if (bVar1 == 0x7b) {
    begin = begin + 1;
    if (begin != end) {
      local_78._M_dataplus._M_p = (pointer)handler;
      begin = parse_arg_id<char,duckdb_fmt::v6::internal::width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>>
                        (begin,end,
                         (width_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                          *)&local_78);
    }
    if ((begin == end) || (*begin != 0x7d)) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"invalid format string","");
      specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error(&handler->
                  super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                 ,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    else {
      begin = (char *)((byte *)begin + 1);
    }
  }
  return (char *)(byte *)begin;
}

Assistant:

FMT_CONSTEXPR const Char* parse_width(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}